

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O3

HullError __thiscall HullLibrary::ReleaseResult(HullLibrary *this,HullResult *result)

{
  btVector3 *ptr;
  uint *ptr_00;
  
  if ((result->m_OutputVertices).m_size != 0) {
    result->mNumOutputVertices = 0;
    ptr = (result->m_OutputVertices).m_data;
    if ((ptr != (btVector3 *)0x0) && ((result->m_OutputVertices).m_ownsMemory == true)) {
      btAlignedFreeInternal(ptr);
    }
    (result->m_OutputVertices).m_ownsMemory = true;
    (result->m_OutputVertices).m_data = (btVector3 *)0x0;
    (result->m_OutputVertices).m_size = 0;
    (result->m_OutputVertices).m_capacity = 0;
  }
  if ((result->m_Indices).m_size != 0) {
    result->mNumIndices = 0;
    ptr_00 = (result->m_Indices).m_data;
    if ((ptr_00 != (uint *)0x0) && ((result->m_Indices).m_ownsMemory == true)) {
      btAlignedFreeInternal(ptr_00);
    }
    (result->m_Indices).m_ownsMemory = true;
    (result->m_Indices).m_data = (uint *)0x0;
    (result->m_Indices).m_size = 0;
    (result->m_Indices).m_capacity = 0;
  }
  return QE_OK;
}

Assistant:

HullError HullLibrary::ReleaseResult(HullResult &result) // release memory allocated for this result, we are done with it.
{
	if ( result.m_OutputVertices.size())
	{
		result.mNumOutputVertices=0;
		result.m_OutputVertices.clear();
	}
	if ( result.m_Indices.size() )
	{
		result.mNumIndices=0;
		result.m_Indices.clear();
	}
	return QE_OK;
}